

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Colour.cpp
# Opt level: O3

void __thiscall Colour::Colour(Colour *this,string *name,int hexValue)

{
  GLfloat *pGVar1;
  uint uVar2;
  uint uVar3;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  uVar3 = (uint)hexValue >> 0x10 & 0xff;
  this->r = uVar3;
  uVar2 = (uint)hexValue >> 8 & 0xff;
  this->g = uVar2;
  this->b = hexValue & 0xffU;
  pGVar1 = (GLfloat *)operator_new__(0xc);
  this->colour = pGVar1;
  *pGVar1 = (float)uVar3 / 255.0;
  pGVar1[1] = (float)uVar2 / 255.0;
  pGVar1[2] = (float)(hexValue & 0xffU) / 255.0;
  std::__cxx11::string::_M_assign((string *)&this->name);
  return;
}

Assistant:

Colour::Colour(const string& name, int hexValue) {
    r = ((hexValue >> 16) & 0xff);
    g = ((hexValue >> 8) & 0xff);
    b = (hexValue & 0xff);
    
    colour = new GLfloat[3];
    this->colour[0] = r/255.f;
    this->colour[1] = g/255.f;
    this->colour[2] = b/255.f;
    
    this->name = name;
}